

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffie-hellman.c
# Opt level: O2

mp_int * dh_create_e(dh_ctx *ctx)

{
  mp_int *pmVar1;
  mp_int *r;
  mp_int *pmVar2;
  
  pmVar1 = mp_from_integer(2);
  r = mp_copy(ctx->q);
  mp_sub_integer_into(r,r,1);
  pmVar2 = mp_random_in_range_fn(pmVar1,r,random_read);
  ctx->x = pmVar2;
  mp_free(pmVar1);
  mp_free(r);
  pmVar1 = mp_modpow(ctx->g,ctx->x,ctx->p);
  ctx->e = pmVar1;
  return pmVar1;
}

Assistant:

mp_int *dh_create_e(dh_ctx *ctx)
{
    /*
     * Lower limit is just 2.
     */
    mp_int *lo = mp_from_integer(2);

    /*
     * Upper limit.
     */
    mp_int *hi = mp_copy(ctx->q);
    mp_sub_integer_into(hi, hi, 1);

    /*
     * Make a random number in that range.
     */
    ctx->x = mp_random_in_range(lo, hi);
    mp_free(lo);
    mp_free(hi);

    /*
     * Now compute e = g^x mod p.
     */
    ctx->e = mp_modpow(ctx->g, ctx->x, ctx->p);

    return ctx->e;
}